

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O0

uint __thiscall llvm::DWARFVerifier::verifyDebugInfoCallSite(DWARFVerifier *this,DWARFDie *Die)

{
  DIDumpOptions DumpOpts;
  DIDumpOptions DumpOpts_00;
  DIDumpOptions DumpOpts_01;
  DIDumpOptions DumpOpts_02;
  DWARFDebugInfoEntry *pDVar1;
  bool bVar2;
  Tag TVar3;
  raw_ostream *prVar4;
  byte local_111;
  DIDumpOptions local_108;
  DIDumpOptions local_f0;
  Attribute local_d4 [6];
  initializer_list<llvm::dwarf::Attribute> local_c8;
  ArrayRef<llvm::dwarf::Attribute> local_b8;
  undefined1 local_a8 [8];
  Optional<llvm::DWARFFormValue> CallAttr;
  undefined8 local_68;
  undefined8 local_60;
  DIDumpOptions local_48;
  undefined1 local_30 [8];
  DWARFDie Curr;
  DWARFDie *Die_local;
  DWARFVerifier *this_local;
  
  Curr.Die = (DWARFDebugInfoEntry *)Die;
  TVar3 = DWARFDie::getTag(Die);
  if ((TVar3 == DW_TAG_call_site) ||
     (TVar3 = DWARFDie::getTag((DWARFDie *)Curr.Die), TVar3 == DW_TAG_GNU_call_site)) {
    _local_30 = DWARFDie::getParent((DWARFDie *)Curr.Die);
    while( true ) {
      bVar2 = DWARFDie::isValid((DWARFDie *)local_30);
      local_111 = 0;
      if (bVar2) {
        bVar2 = DWARFDie::isSubprogramDIE((DWARFDie *)local_30);
        local_111 = bVar2 ^ 0xff;
      }
      if ((local_111 & 1) == 0) {
        bVar2 = DWARFDie::isValid((DWARFDie *)local_30);
        if (!bVar2) {
          prVar4 = error(this);
          raw_ostream::operator<<(prVar4,"Call site entry not nested within a valid subprogram:");
          pDVar1 = Curr.Die;
          prVar4 = this->OS;
          memset(&CallAttr.Storage.hasVal,0,0x18);
          DIDumpOptions::DIDumpOptions((DIDumpOptions *)&CallAttr.Storage.hasVal);
          DumpOpts_00._8_8_ = local_68;
          DumpOpts_00._0_8_ = CallAttr.Storage._48_8_;
          DumpOpts_00._16_8_ = local_60;
          DWARFDie::dump((DWARFDie *)pDVar1,prVar4,0,DumpOpts_00);
          return 1;
        }
        local_d4[0] = DW_AT_call_all_calls;
        local_d4[1] = 0x7b;
        local_d4[2] = 0x7c;
        local_d4[3] = 0x2117;
        local_d4[4] = 0x2118;
        local_d4[5] = 0x2116;
        local_c8._M_array = local_d4;
        local_c8._M_len = 6;
        ArrayRef<llvm::dwarf::Attribute>::ArrayRef(&local_b8,&local_c8);
        DWARFDie::find((Optional<llvm::DWARFFormValue> *)local_a8,(DWARFDie *)local_30,local_b8);
        bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)local_a8);
        if (!bVar2) {
          prVar4 = error(this);
          raw_ostream::operator<<
                    (prVar4,"Subprogram with call site entry has no DW_AT_call attribute:");
          prVar4 = this->OS;
          memset(&local_f0,0,0x18);
          DIDumpOptions::DIDumpOptions(&local_f0);
          DumpOpts_01.ParentRecurseDepth = local_f0.ParentRecurseDepth;
          DumpOpts_01.Version = local_f0.Version;
          DumpOpts_01.AddrSize = local_f0.AddrSize;
          DumpOpts_01.ShowAddresses = local_f0.ShowAddresses;
          DumpOpts_01.DumpType = local_f0.DumpType;
          DumpOpts_01.ChildRecurseDepth = local_f0.ChildRecurseDepth;
          DumpOpts_01.ShowChildren = local_f0.ShowChildren;
          DumpOpts_01.ShowParents = local_f0.ShowParents;
          DumpOpts_01.ShowForm = local_f0.ShowForm;
          DumpOpts_01.SummarizeTypes = local_f0.SummarizeTypes;
          DumpOpts_01.Verbose = local_f0.Verbose;
          DumpOpts_01.DisplayRawContents = local_f0.DisplayRawContents;
          DumpOpts_01._22_2_ = local_f0._22_2_;
          DWARFDie::dump((DWARFDie *)local_30,prVar4,0,DumpOpts_01);
          pDVar1 = Curr.Die;
          prVar4 = this->OS;
          memset(&local_108,0,0x18);
          DIDumpOptions::DIDumpOptions(&local_108);
          DumpOpts_02.ParentRecurseDepth = local_108.ParentRecurseDepth;
          DumpOpts_02.Version = local_108.Version;
          DumpOpts_02.AddrSize = local_108.AddrSize;
          DumpOpts_02.ShowAddresses = local_108.ShowAddresses;
          DumpOpts_02.DumpType = local_108.DumpType;
          DumpOpts_02.ChildRecurseDepth = local_108.ChildRecurseDepth;
          DumpOpts_02.ShowChildren = local_108.ShowChildren;
          DumpOpts_02.ShowParents = local_108.ShowParents;
          DumpOpts_02.ShowForm = local_108.ShowForm;
          DumpOpts_02.SummarizeTypes = local_108.SummarizeTypes;
          DumpOpts_02.Verbose = local_108.Verbose;
          DumpOpts_02.DisplayRawContents = local_108.DisplayRawContents;
          DumpOpts_02._22_2_ = local_108._22_2_;
          DWARFDie::dump((DWARFDie *)pDVar1,prVar4,1,DumpOpts_02);
          return 1;
        }
        return 0;
      }
      TVar3 = DWARFDie::getTag((DWARFDie *)local_30);
      if (TVar3 == DW_TAG_inlined_subroutine) break;
      _local_30 = DWARFDie::getParent((DWARFDie *)Curr.Die);
    }
    prVar4 = error(this);
    raw_ostream::operator<<(prVar4,"Call site entry nested within inlined subroutine:");
    prVar4 = this->OS;
    memset(&local_48,0,0x18);
    DIDumpOptions::DIDumpOptions(&local_48);
    DumpOpts.ParentRecurseDepth = local_48.ParentRecurseDepth;
    DumpOpts.Version = local_48.Version;
    DumpOpts.AddrSize = local_48.AddrSize;
    DumpOpts.ShowAddresses = local_48.ShowAddresses;
    DumpOpts.DumpType = local_48.DumpType;
    DumpOpts.ChildRecurseDepth = local_48.ChildRecurseDepth;
    DumpOpts.ShowChildren = local_48.ShowChildren;
    DumpOpts.ShowParents = local_48.ShowParents;
    DumpOpts.ShowForm = local_48.ShowForm;
    DumpOpts.SummarizeTypes = local_48.SummarizeTypes;
    DumpOpts.Verbose = local_48.Verbose;
    DumpOpts.DisplayRawContents = local_48.DisplayRawContents;
    DumpOpts._22_2_ = local_48._22_2_;
    DWARFDie::dump((DWARFDie *)local_30,prVar4,0,DumpOpts);
    this_local._4_4_ = 1;
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

unsigned DWARFVerifier::verifyDebugInfoCallSite(const DWARFDie &Die) {
  if (Die.getTag() != DW_TAG_call_site && Die.getTag() != DW_TAG_GNU_call_site)
    return 0;

  DWARFDie Curr = Die.getParent();
  for (; Curr.isValid() && !Curr.isSubprogramDIE(); Curr = Die.getParent()) {
    if (Curr.getTag() == DW_TAG_inlined_subroutine) {
      error() << "Call site entry nested within inlined subroutine:";
      Curr.dump(OS);
      return 1;
    }
  }

  if (!Curr.isValid()) {
    error() << "Call site entry not nested within a valid subprogram:";
    Die.dump(OS);
    return 1;
  }

  Optional<DWARFFormValue> CallAttr =
      Curr.find({DW_AT_call_all_calls, DW_AT_call_all_source_calls,
                 DW_AT_call_all_tail_calls, DW_AT_GNU_all_call_sites,
                 DW_AT_GNU_all_source_call_sites,
                 DW_AT_GNU_all_tail_call_sites});
  if (!CallAttr) {
    error() << "Subprogram with call site entry has no DW_AT_call attribute:";
    Curr.dump(OS);
    Die.dump(OS, /*indent*/ 1);
    return 1;
  }

  return 0;
}